

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddSymm.c
# Opt level: O2

int cuddZddSymmSiftingConv(DdManager *table,int lower,int upper)

{
  size_t __size;
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int *piVar5;
  void *__base;
  ulong uVar6;
  long lVar7;
  DdNode *pDVar8;
  DdNode *pDVar9;
  DdSubtable *pDVar10;
  DdNode *pDVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  uint initial_size;
  long lVar16;
  DdHalfWord x;
  uint x_00;
  DdNode *pDVar17;
  bool bVar18;
  uint local_54;
  int symvars;
  int symgroups;
  
  local_54 = table->keysZ;
  uVar1 = table->sizeZ;
  __size = (long)(int)uVar1 * 4;
  piVar5 = (int *)malloc(__size);
  zdd_entry = piVar5;
  if (piVar5 == (int *)0x0) {
    table->errorCode = CUDD_MEMORY_OUT;
    __base = (void *)0x0;
  }
  else {
    __base = malloc(__size);
    if (__base == (void *)0x0) {
      table->errorCode = CUDD_MEMORY_OUT;
    }
    else {
      uVar6 = 0;
      uVar13 = 0;
      if (0 < (int)uVar1) {
        uVar13 = (ulong)uVar1;
      }
      for (; uVar13 != uVar6; uVar6 = uVar6 + 1) {
        piVar5[uVar6] = table->subtableZ[table->permZ[uVar6]].keys;
        *(int *)((long)__base + uVar6 * 4) = (int)uVar6;
      }
      qsort(__base,(long)(int)uVar1,4,cuddZddUniqueCompare);
      lVar7 = (long)lower;
      lVar16 = lVar7 * 0x38 + 0x1c;
      for (; lVar7 <= upper; lVar7 = lVar7 + 1) {
        *(int *)((long)&table->subtableZ->nodelist + lVar16) = (int)lVar7;
        lVar16 = lVar16 + 0x38;
      }
      uVar2 = table->siftMaxVar;
      if (table->sizeZ < table->siftMaxVar) {
        uVar2 = table->sizeZ;
      }
      uVar13 = 0;
      uVar6 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar6 = uVar13;
      }
      while ((uVar6 != uVar13 && (zddTotalNumberSwapping < table->siftMaxSwap))) {
        uVar2 = table->permZ[*(int *)((long)__base + uVar13 * 4)];
        if (((int)uVar2 <= upper && lower <= (int)uVar2) &&
           ((table->subtableZ[(int)uVar2].next == uVar2 &&
            (iVar3 = cuddZddSymmSiftingAux(table,uVar2,lower,upper), iVar3 == 0))))
        goto LAB_0067bc0e;
        uVar13 = uVar13 + 1;
      }
LAB_0067bb3a:
      piVar5 = zdd_entry;
      uVar2 = table->keysZ;
      if (local_54 <= uVar2) {
        cuddZddSymmSummary(table,lower,upper,&symvars,&symgroups);
        free(__base);
        if (zdd_entry != (int *)0x0) {
          free(zdd_entry);
          zdd_entry = (int *)0x0;
        }
        return symvars + 1;
      }
      uVar6 = 0;
      uVar14 = lower;
      while ((int)uVar14 <= upper) {
        do {
          uVar15 = uVar14;
          uVar14 = table->subtableZ[(int)uVar15].next;
        } while (uVar15 < uVar14);
        iVar3 = table->invpermZ[(int)uVar15];
        piVar5[iVar3] = table->subtableZ[(int)uVar15].keys;
        *(int *)((long)__base + uVar6 * 4) = iVar3;
        uVar6 = uVar6 + 1;
        uVar14 = uVar15 + 1;
      }
      qsort(__base,uVar6 & 0xffffffff,4,cuddZddUniqueCompare);
      uVar14 = table->siftMaxVar;
      if ((int)uVar1 < table->siftMaxVar) {
        uVar14 = uVar1;
      }
      if ((int)uVar14 < 1) {
        uVar14 = 0;
      }
      uVar6 = 0;
      while( true ) {
        local_54 = uVar2;
        if ((uVar6 == uVar14) || (table->siftMaxSwap <= zddTotalNumberSwapping)) goto LAB_0067bb3a;
        pDVar10 = table->subtableZ;
        uVar15 = table->permZ[*(int *)((long)__base + uVar6 * 4)];
        uVar13 = (ulong)(int)uVar15;
        uVar12 = pDVar10[uVar13].next;
        if (uVar12 <= uVar15) break;
LAB_0067b6fe:
        uVar6 = uVar6 + 1;
      }
      initial_size = table->keysZ;
      if (uVar15 == lower) {
        pDVar8 = (DdNode *)cuddZddSymmSifting_down(table,lower,upper,initial_size);
        if (pDVar8 == (DdNode *)0x0) {
          pDVar10 = table->subtableZ;
          uVar13 = (ulong)(uint)lower;
          do {
            uVar15 = (uint)uVar13;
            uVar13 = (ulong)pDVar10[(int)uVar15].next;
          } while (uVar15 < pDVar10[(int)uVar15].next);
LAB_0067b841:
          iVar3 = (int)uVar13;
          do {
            uVar15 = (uint)uVar13;
            uVar13 = (ulong)pDVar10[(int)uVar15].next;
          } while (uVar15 < pDVar10[(int)uVar15].next);
          if (lower - uVar12 != uVar15 - iVar3) {
LAB_0067baac:
            initial_size = table->keysZ;
            pDVar11 = (DdNode *)cuddZddSymmSifting_up(table,iVar3,lower,initial_size);
            pDVar9 = pDVar11;
LAB_0067bac8:
            iVar3 = cuddZddSymmSiftingBackward(table,(Move *)pDVar11,initial_size);
            goto LAB_0067bacd;
          }
        }
        else {
          if (pDVar8 == (DdNode *)0x1) goto LAB_0067bc0e;
          pDVar10 = table->subtableZ;
          uVar13 = (ulong)pDVar8->ref;
          if (pDVar10[uVar13].next != pDVar8->ref) goto LAB_0067b841;
        }
        iVar3 = cuddZddSymmSiftingBackward(table,(Move *)pDVar8,initial_size);
        pDVar9 = (DdNode *)0x0;
LAB_0067bacd:
        if (iVar3 != 0) {
          while (pDVar8 != (DdNode *)0x0) {
            pDVar11 = (pDVar8->type).kids.T;
            pDVar8->ref = 0;
            pDVar8->next = table->nextFree;
            table->nextFree = pDVar8;
            pDVar8 = pDVar11;
          }
          while (pDVar9 != (DdNode *)0x0) {
            pDVar8 = (pDVar9->type).kids.T;
            pDVar9->ref = 0;
            pDVar9->next = table->nextFree;
            table->nextFree = pDVar9;
            pDVar9 = pDVar8;
          }
          goto LAB_0067b6fe;
        }
      }
      else {
        uVar4 = upper;
        if (upper == uVar15) {
          do {
            uVar15 = pDVar10[(int)uVar4].next;
            bVar18 = uVar4 < uVar15;
            uVar12 = uVar15;
            uVar4 = uVar15;
          } while (bVar18);
          do {
            uVar4 = uVar12;
            uVar12 = pDVar10[(int)uVar4].next;
          } while (uVar4 < pDVar10[(int)uVar4].next);
          pDVar9 = (DdNode *)cuddZddSymmSifting_up(table,uVar15,lower,initial_size);
          if (pDVar9 == (DdNode *)0x0) {
            uVar12 = uVar15;
            do {
              x_00 = uVar12;
              uVar12 = table->subtableZ[(int)x_00].next;
            } while (x_00 < uVar12);
LAB_0067b8dc:
            if (uVar4 - uVar15 != x_00 - uVar12) goto LAB_0067ba6d;
          }
          else {
            if (pDVar9 == (DdNode *)0x1) goto LAB_0067bc0e;
            x_00 = pDVar9->index;
            if (table->subtableZ[x_00].next != x_00) {
              uVar12 = table->subtableZ[(int)x_00].next;
              goto LAB_0067b8dc;
            }
          }
          iVar3 = cuddZddSymmSiftingBackward(table,(Move *)pDVar9,initial_size);
          pDVar8 = (DdNode *)0x0;
          goto LAB_0067bacd;
        }
        if ((int)(uVar15 - lower) <= (int)(upper - uVar15)) {
          pDVar9 = (DdNode *)cuddZddSymmSifting_up(table,uVar12,lower,initial_size);
          if (pDVar9 == (DdNode *)0x0) {
            do {
              x = uVar12;
              uVar12 = table->subtableZ[(int)x].next;
            } while (x < uVar12);
          }
          else {
            if (pDVar9 == (DdNode *)0x1) goto LAB_0067bc0e;
            x = pDVar9->index;
            uVar12 = table->subtableZ[(int)x].next;
          }
          pDVar11 = (DdNode *)cuddZddSymmSifting_down(table,x,upper,initial_size);
          pDVar8 = pDVar11;
          if (pDVar11 == (DdNode *)0x0) {
            pDVar10 = table->subtableZ;
            uVar13 = (ulong)x;
            do {
              uVar15 = (uint)uVar13;
              uVar13 = (ulong)pDVar10[(int)uVar15].next;
            } while (uVar15 < pDVar10[(int)uVar15].next);
LAB_0067ba16:
            iVar3 = (int)uVar13;
            do {
              uVar15 = (uint)uVar13;
              uVar13 = (ulong)pDVar10[(int)uVar15].next;
            } while (uVar15 < pDVar10[(int)uVar15].next);
            if (x - uVar12 == uVar15 - iVar3) goto LAB_0067bac8;
            while (pDVar9 != (DdNode *)0x0) {
              pDVar11 = (pDVar9->type).kids.T;
              pDVar9->ref = 0;
              pDVar9->next = table->nextFree;
              table->nextFree = pDVar9;
              pDVar9 = pDVar11;
            }
            goto LAB_0067baac;
          }
          if (pDVar11 != (DdNode *)0x1) {
            pDVar10 = table->subtableZ;
            uVar13 = (ulong)pDVar11->ref;
            if (pDVar10[uVar13].next != pDVar11->ref) goto LAB_0067ba16;
            goto LAB_0067bac8;
          }
          goto LAB_0067bbe3;
        }
        pDVar8 = (DdNode *)cuddZddSymmSifting_down(table,uVar15,upper,initial_size);
        if (pDVar8 == (DdNode *)0x0) {
          pDVar10 = table->subtableZ;
          do {
            uVar15 = (uint)uVar13;
            uVar13 = (ulong)pDVar10[(int)uVar15].next;
          } while (uVar15 < pDVar10[(int)uVar15].next);
        }
        else {
          if (pDVar8 == (DdNode *)0x1) goto LAB_0067bc0e;
          uVar13 = (ulong)pDVar8->ref;
          pDVar10 = table->subtableZ;
        }
        uVar15 = (uint)uVar13;
        do {
          uVar12 = (uint)uVar13;
          uVar13 = (ulong)pDVar10[(int)uVar12].next;
        } while (uVar12 < pDVar10[(int)uVar12].next);
        pDVar11 = (DdNode *)cuddZddSymmSifting_up(table,uVar15,lower,initial_size);
        pDVar9 = pDVar11;
        if (pDVar11 == (DdNode *)0x0) {
          uVar4 = uVar15;
          do {
            x_00 = uVar4;
            uVar4 = table->subtableZ[(int)x_00].next;
          } while (x_00 < uVar4);
LAB_0067b9ea:
          if (uVar12 - uVar15 == x_00 - uVar4) goto LAB_0067bac8;
          while (pDVar8 != (DdNode *)0x0) {
            pDVar11 = (pDVar8->type).kids.T;
            pDVar8->ref = 0;
            pDVar8->next = table->nextFree;
            table->nextFree = pDVar8;
            pDVar8 = pDVar11;
          }
LAB_0067ba6d:
          initial_size = table->keysZ;
          pDVar11 = (DdNode *)cuddZddSymmSifting_down(table,x_00,upper,initial_size);
          pDVar8 = pDVar11;
          goto LAB_0067bac8;
        }
        if (pDVar11 != (DdNode *)0x1) {
          x_00 = pDVar11->index;
          if (table->subtableZ[x_00].next == x_00) goto LAB_0067bac8;
          uVar4 = table->subtableZ[(int)x_00].next;
          goto LAB_0067b9ea;
        }
        pDVar9 = (DdNode *)0x1;
      }
      if ((DdNode *)0x1 < pDVar8) {
        pDVar11 = table->nextFree;
        do {
          pDVar17 = pDVar8;
          pDVar8 = (pDVar17->type).kids.T;
          pDVar17->ref = 0;
          pDVar17->next = pDVar11;
          pDVar11 = pDVar17;
        } while (pDVar8 != (DdNode *)0x0);
        table->nextFree = pDVar17;
      }
LAB_0067bbe3:
      if ((DdNode *)0x1 < pDVar9) {
        pDVar8 = table->nextFree;
        do {
          pDVar11 = pDVar9;
          pDVar9 = (pDVar11->type).kids.T;
          pDVar11->ref = 0;
          pDVar11->next = pDVar8;
          pDVar8 = pDVar11;
        } while (pDVar9 != (DdNode *)0x0);
        table->nextFree = pDVar11;
      }
    }
LAB_0067bc0e:
    if (zdd_entry != (int *)0x0) {
      free(zdd_entry);
      zdd_entry = (int *)0x0;
    }
  }
  free(__base);
  return 0;
}

Assistant:

int
cuddZddSymmSiftingConv(
  DdManager * table,
  int  lower,
  int  upper)
{
    int         i;
    int         *var;
    int         nvars;
    int         initialSize;
    int         x;
    int         result;
    int         symvars;
    int         symgroups;
    int         classes;
    int         iteration;
#ifdef DD_STATS
    int         previousSize;
#endif

    initialSize = table->keysZ;

    nvars = table->sizeZ;

    /* Find order in which to sift variables. */
    var = NULL;
    zdd_entry = ABC_ALLOC(int, nvars);
    if (zdd_entry == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        goto cuddZddSymmSiftingConvOutOfMem;
    }
    var = ABC_ALLOC(int, nvars);
    if (var == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        goto cuddZddSymmSiftingConvOutOfMem;
    }

    for (i = 0; i < nvars; i++) {
        x = table->permZ[i];
        zdd_entry[i] = table->subtableZ[x].keys;
        var[i] = i;
    }

    qsort((void *)var, nvars, sizeof(int), (DD_QSFP)cuddZddUniqueCompare);

    /* Initialize the symmetry of each subtable to itself
    ** for first pass of converging symmetric sifting.
    */
    for (i = lower; i <= upper; i++)
        table->subtableZ[i].next = i;

    iteration = ddMin(table->siftMaxVar, table->sizeZ);
    for (i = 0; i < iteration; i++) {
        if (zddTotalNumberSwapping >= table->siftMaxSwap)
            break;
        x = table->permZ[var[i]];
        if (x < lower || x > upper) continue;
        /* Only sift if not in symmetry group already. */
        if (table->subtableZ[x].next == (unsigned) x) {
#ifdef DD_STATS
            previousSize = table->keysZ;
#endif
            result = cuddZddSymmSiftingAux(table, x, lower, upper);
            if (!result)
                goto cuddZddSymmSiftingConvOutOfMem;
#ifdef DD_STATS
            if (table->keysZ < (unsigned) previousSize) {
                (void) fprintf(table->out,"-");
            } else if (table->keysZ > (unsigned) previousSize) {
                (void) fprintf(table->out,"+");
#ifdef DD_VERBOSE
                (void) fprintf(table->out,"\nSize increased from %d to %d while sifting variable %d\n", previousSize, table->keysZ, var[i]);
#endif
            } else {
                (void) fprintf(table->out,"=");
            }
            fflush(table->out);
#endif
        }
    }

    /* Sifting now until convergence. */
    while ((unsigned) initialSize > table->keysZ) {
        initialSize = table->keysZ;
#ifdef DD_STATS
        (void) fprintf(table->out,"\n");
#endif
        /* Here we consider only one representative for each symmetry class. */
        for (x = lower, classes = 0; x <= upper; x++, classes++) {
            while ((unsigned) x < table->subtableZ[x].next)
                x = table->subtableZ[x].next;
            /* Here x is the largest index in a group.
            ** Groups consists of adjacent variables.
            ** Hence, the next increment of x will move it to a new group.
            */
            i = table->invpermZ[x];
            zdd_entry[i] = table->subtableZ[x].keys;
            var[classes] = i;
        }

        qsort((void *)var,classes,sizeof(int),(DD_QSFP)cuddZddUniqueCompare);

        /* Now sift. */
        iteration = ddMin(table->siftMaxVar, nvars);
        for (i = 0; i < iteration; i++) {
            if (zddTotalNumberSwapping >= table->siftMaxSwap)
                break;
            x = table->permZ[var[i]];
            if ((unsigned) x >= table->subtableZ[x].next) {
#ifdef DD_STATS
                previousSize = table->keysZ;
#endif
                result = cuddZddSymmSiftingConvAux(table, x, lower, upper);
                if (!result)
                    goto cuddZddSymmSiftingConvOutOfMem;
#ifdef DD_STATS
                if (table->keysZ < (unsigned) previousSize) {
                    (void) fprintf(table->out,"-");
                } else if (table->keysZ > (unsigned) previousSize) {
                    (void) fprintf(table->out,"+");
#ifdef DD_VERBOSE
                (void) fprintf(table->out,"\nSize increased from %d to %d while sifting variable %d\n", previousSize, table->keysZ, var[i]);
#endif
                } else {
                    (void) fprintf(table->out,"=");
                }
                fflush(table->out);
#endif
            }
        } /* for */
    }

    cuddZddSymmSummary(table, lower, upper, &symvars, &symgroups);

#ifdef DD_STATS
    (void) fprintf(table->out,"\n#:S_SIFTING %8d: symmetric variables\n",
                   symvars);
    (void) fprintf(table->out,"#:G_SIFTING %8d: symmetric groups\n",
                   symgroups);
#endif

    ABC_FREE(var);
    ABC_FREE(zdd_entry);

    return(1+symvars);

cuddZddSymmSiftingConvOutOfMem:

    if (zdd_entry != NULL)
        ABC_FREE(zdd_entry);
    if (var != NULL)
        ABC_FREE(var);

    return(0);

}